

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LinearScan.cpp
# Opt level: O0

void __thiscall LinearScan::Init(LinearScan *this)

{
  bool bVar1;
  uint sourceContextId;
  uint functionId;
  RegNum local_11;
  RegNum reg;
  LinearScan *this_local;
  
  for (local_11 = RegRAX; local_11 != RegNumCount; local_11 = local_11 + RegRAX) {
    bVar1 = IsAllocatable(this,local_11);
    if (!bVar1) {
      BVUnitT<unsigned_long>::Set(&this->activeRegs,(uint)local_11);
      bVar1 = IRType_IsFloat(RegTypes[local_11]);
      if (bVar1) {
        this->floatRegUsedCount = this->floatRegUsedCount + 1;
      }
      else {
        this->intRegUsedCount = this->intRegUsedCount + 1;
      }
    }
    if (RegTypes[local_11] == TyInt64) {
      BVUnitT<unsigned_long>::Set(&this->int32Regs,(uint)local_11);
      this->numInt32Regs = this->numInt32Regs + 1;
    }
    else if (RegTypes[local_11] == TyFloat64) {
      BVUnitT<unsigned_long>::Set(&this->floatRegs,(uint)local_11);
      this->numFloatRegs = this->numFloatRegs + 1;
    }
    bVar1 = IsCallerSaved(this,local_11);
    if (bVar1) {
      BVUnitT<unsigned_long>::Set(&this->callerSavedRegs,(uint)local_11);
    }
    bVar1 = IsCalleeSaved(local_11);
    if (bVar1) {
      BVUnitT<unsigned_long>::Set(&this->calleeSavedRegs,(uint)local_11);
    }
    this->regContent[local_11] = (Lifetime *)0x0;
  }
  BVUnitT<unsigned_long>::ClearAll(&this->instrUseRegs);
  BVUnitT<unsigned_long>::ClearAll(&this->secondChanceRegs);
  LinearScanMDShared::Init(&(this->linearScanMD).super_LinearScanMDShared,this);
  (this->nonAllocatableRegs).word = (this->activeRegs).word;
  sourceContextId = Func::GetSourceContextId(this->func);
  functionId = Func::GetLocalFunctionId(this->func);
  bVar1 = Js::Phases::IsEnabled((Phases *)&DAT_01ec1678,LinearScanPhase,sourceContextId,functionId);
  if (bVar1) {
    Func::DumpHeader(this->func);
  }
  return;
}

Assistant:

void
LinearScan::Init()
{
    FOREACH_REG(reg)
    {
        // Registers that can't be used are set to active, and will remain this way
        if (!LinearScan::IsAllocatable(reg))
        {
            this->activeRegs.Set(reg);
            if (IRType_IsFloat(RegTypes[reg]))
            {
                this->floatRegUsedCount++;
            }
            else
            {
                this->intRegUsedCount++;
            }
        }
        if (RegTypes[reg] == TyMachReg)
        {
            // JIT64_TODO: Rename int32Regs to machIntRegs.
            this->int32Regs.Set(reg);
            numInt32Regs++;
        }
        else if (RegTypes[reg] == TyFloat64)
        {
            this->floatRegs.Set(reg);
            numFloatRegs++;
        }
        if (LinearScan::IsCallerSaved(reg))
        {
            this->callerSavedRegs.Set(reg);
        }
        if (LinearScan::IsCalleeSaved(reg))
        {
            this->calleeSavedRegs.Set(reg);
        }
        this->regContent[reg] = nullptr;
    } NEXT_REG;

    this->instrUseRegs.ClearAll();
    this->secondChanceRegs.ClearAll();

    this->linearScanMD.Init(this);

#if DBG
    this->nonAllocatableRegs = this->activeRegs;
#endif

#if DBG_DUMP
    if (PHASE_TRACE(Js::LinearScanPhase, this->func))
    {
        this->func->DumpHeader();
    }
#endif
}